

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::GetRethrowLabel(TypeChecker *this,Index depth,Label **out_label)

{
  pointer pLVar1;
  Result RVar2;
  Enum EVar3;
  long lVar4;
  uint __val;
  string candidates;
  string local_50;
  
  RVar2 = GetLabel(this,depth,out_label);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Ok;
    if ((*out_label)->label_type != Catch) {
      candidates._M_dataplus._M_p = (pointer)&candidates.field_2;
      candidates._M_string_length = 0;
      candidates.field_2._M_local_buf[0] = '\0';
      __val = 0;
      while( true ) {
        pLVar1 = (this->label_stack_).
                 super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = (long)(this->label_stack_).
                      super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
        if ((ulong)(lVar4 / 0x48) <= (ulong)__val) break;
        if (*(int *)((long)pLVar1 + ~(ulong)__val * 0x48 + lVar4) == 7) {
          if (candidates._M_string_length != 0) {
            std::__cxx11::string::append((char *)&candidates);
          }
          std::__cxx11::to_string(&local_50,__val);
          std::__cxx11::string::append((string *)&candidates);
          std::__cxx11::string::_M_dispose();
        }
        __val = __val + 1;
      }
      if (candidates._M_string_length == 0) {
        PrintError(this,"rethrow not in try catch block",lVar4 % 0x48);
      }
      else {
        PrintError(this,"invalid rethrow depth: %u (catches: %s)",(ulong)depth,
                   candidates._M_dataplus._M_p);
      }
      *out_label = (Label *)0x0;
      std::__cxx11::string::_M_dispose();
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::GetRethrowLabel(Index depth, Label** out_label) {
  if (Failed(GetLabel(depth, out_label))) {
    return Result::Error;
  }

  if ((*out_label)->label_type == LabelType::Catch) {
    return Result::Ok;
  }

  std::string candidates;
  for (Index idx = 0; idx < label_stack_.size(); idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      if (!candidates.empty()) {
        candidates.append(", ");
      }
      candidates.append(std::to_string(idx));
    }
  }

  if (candidates.empty()) {
    PrintError("rethrow not in try catch block");
  } else {
    PrintError("invalid rethrow depth: %" PRIindex " (catches: %s)", depth,
               candidates.c_str());
  }
  *out_label = nullptr;
  return Result::Error;
}